

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void Cmd_unset(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FBaseCVar *pFVar3;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 != 2) {
    Printf("usage: unset <variable>\n");
    return;
  }
  pcVar2 = FCommandLine::operator[](argv,1);
  pFVar3 = FindCVar(pcVar2,(FBaseCVar **)0x0);
  if (pFVar3 != (FBaseCVar *)0x0) {
    if ((pFVar3->Flags & 0x20) == 0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("Cannot unset %s\n",pcVar2);
      return;
    }
    (*pFVar3->_vptr_FBaseCVar[1])(pFVar3);
    return;
  }
  return;
}

Assistant:

CCMD (unset)
{
	if (argv.argc() != 2)
	{
		Printf ("usage: unset <variable>\n");
	}
	else
	{
		FBaseCVar *var = FindCVar (argv[1], NULL);
		if (var != NULL)
		{
			if (var->GetFlags() & CVAR_UNSETTABLE)
			{
				delete var;
			}
			else
			{
				Printf ("Cannot unset %s\n", argv[1]);
			}
		}
	}
}